

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  int iVar1;
  ParameterError PVar2;
  CURLcode result_00;
  CURLSH *share_00;
  bool local_59;
  char *local_58;
  CURLSH *share;
  OperationConfig *operation;
  size_t count;
  ParameterError res;
  char *first_arg;
  CURLcode result;
  char **argv_local;
  int argc_local;
  GlobalConfig *global_local;
  
  first_arg._4_4_ = CURLE_OK;
  if (argc < 2) {
    local_58 = (char *)0x0;
  }
  else {
    local_58 = strdup(argv[1]);
  }
  setlocale(6,"");
  setlocale(1,"C");
  if (((argc == 1) ||
      (((local_58 != (char *)0x0 && (iVar1 = strncmp(local_58,"-q",2), iVar1 != 0)) &&
       (iVar1 = strcmp(local_58,"--disable"), iVar1 != 0)))) &&
     ((parseconfig((char *)0x0,global), argc < 2 && (global->first->url_list == (getout *)0x0)))) {
    helpf(tool_stderr,(char *)0x0);
    first_arg._4_4_ = CURLE_FAILED_INIT;
  }
  if (local_58 != (char *)0x0) {
    free(local_58);
  }
  if (first_arg._4_4_ == CURLE_OK) {
    PVar2 = parse_args(global,argc,argv);
    if (PVar2 == PARAM_OK) {
      if (global->libcurl != (char *)0x0) {
        first_arg._4_4_ = easysrc_init();
      }
      if (first_arg._4_4_ == CURLE_OK) {
        operation = (OperationConfig *)0x0;
        share = (CURLSH *)global->first;
        share_00 = (CURLSH *)curl_share_init();
        if (share_00 == (CURLSH *)0x0) {
          if (global->libcurl != (char *)0x0) {
            easysrc_cleanup();
          }
          first_arg._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        if (first_arg._4_4_ == CURLE_OK) {
          curl_share_setopt(share_00,1,2);
          curl_share_setopt(share_00,1,3);
          curl_share_setopt(share_00,1,4);
          curl_share_setopt(share_00,1,5);
          curl_share_setopt(share_00,1,6);
          curl_share_setopt(share_00,1,7);
          do {
            result_00 = get_args((OperationConfig *)share,(size_t)operation);
            share = *(CURLSH **)(share + 0x530);
            local_59 = result_00 == CURLE_OK && share != (CURLSH *)0x0;
            operation = (OperationConfig *)&operation->field_0x1;
          } while (local_59);
          global->current = global->first;
          first_arg._4_4_ = run_all_transfers(global,share_00,result_00);
          curl_share_cleanup(share_00);
          if (global->libcurl != (char *)0x0) {
            easysrc_cleanup();
            dumpeasysrc(global);
          }
        }
      }
      else {
        errorf(global,"out of memory");
      }
    }
    else {
      first_arg._4_4_ = CURLE_OK;
      if (PVar2 == PARAM_HELP_REQUESTED) {
        tool_help(global->help_category);
      }
      else if (PVar2 == PARAM_MANUAL_REQUESTED) {
        hugehelp();
      }
      else if (PVar2 == PARAM_VERSION_INFO_REQUESTED) {
        tool_version_info();
      }
      else if (PVar2 == PARAM_ENGINES_REQUESTED) {
        tool_list_engines();
      }
      else if (PVar2 != PARAM_CA_EMBED_REQUESTED) {
        if (PVar2 == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL) {
          first_arg._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
        }
        else if (PVar2 == PARAM_READ_ERROR) {
          first_arg._4_4_ = CURLE_READ_ERROR;
        }
        else {
          first_arg._4_4_ = CURLE_FAILED_INIT;
        }
      }
    }
  }
  varcleanup(global);
  return first_arg._4_4_;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  char *first_arg = argc > 1 ? curlx_convert_tchar_to_UTF8(argv[1]) : NULL;

#ifdef HAVE_SETLOCALE
  /* Override locale for number parsing (only) */
  setlocale(LC_ALL, "");
  setlocale(LC_NUMERIC, "C");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (first_arg && strncmp(first_arg, "-q", 2) &&
      strcmp(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(tool_stderr, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  curlx_unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      /* Check if we were asked to dump the embedded CA bundle */
      else if(res == PARAM_CA_EMBED_REQUESTED) {
#ifdef CURL_CA_EMBED
        printf("%s", curl_ca_embed);
#endif
      }
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else if(res == PARAM_READ_ERROR)
        result = CURLE_READ_ERROR;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
          result = CURLE_OUT_OF_MEMORY;
        }

        if(!result) {
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
          curl_share_setopt(share, CURLSHOPT_SHARE,
                            CURL_LOCK_DATA_SSL_SESSION);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_HSTS);

          /* Get the required arguments for each operation */
          do {
            result = get_args(operation, count++);

            operation = operation->next;
          } while(!result && operation);

          /* Set the current operation pointer */
          global->current = global->first;

          /* now run! */
          result = run_all_transfers(global, share, result);

          curl_share_cleanup(share);
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();

            /* Dump the libcurl code if previously enabled */
            dumpeasysrc(global);
          }
        }
      }
      else
        errorf(global, "out of memory");
    }
  }

  varcleanup(global);

  return result;
}